

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O0

int Sfm_DecPeformDec_rec
              (Sfm_Dec_t *p,word *pTruth,int *pSupp,int *pAssump,int nAssump,word (*Masks) [8],
              int fCofactor,int nSuppAdd)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  abctime aVar6;
  word *pwVar7;
  word *pwVar8;
  int local_2a4;
  ulong local_250;
  ulong local_248;
  int local_200 [2];
  int nSupp [2];
  int Supp [2] [16];
  int local_16c;
  int w;
  word MasksNext [2] [8];
  word uTruth [2] [4];
  int *piStack_98;
  int nFinal;
  int *pFinal;
  int fHas1s;
  int fHas0s;
  word *pPats;
  int Impls [2];
  abctime clk;
  word *pDivWords;
  int local_60;
  int Var;
  int status;
  int iLit;
  int d;
  int i;
  int c;
  int nBTLimit;
  word (*Masks_local) [8];
  int nAssump_local;
  int *pAssump_local;
  int *pSupp_local;
  word *pTruth_local;
  Sfm_Dec_t *p_local;
  
  iVar4 = p->pPars->nBTLimit;
  pwVar8 = p->pDivWords[nAssump];
  if (8 < nAssump) {
    __assert_fail("nAssump <= SFM_SUPP_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                  ,0x32f,
                  "int Sfm_DecPeformDec_rec(Sfm_Dec_t *, word *, int *, int *, int, word (*)[8], int, int)"
                 );
  }
  if (p->pPars->fVeryVerbose != 0) {
    printf("\nObject %d\n",(ulong)(uint)p->iTarget);
    uVar3 = p->nDivs;
    uVar1 = Vec_IntSize(&p->vObjGates);
    printf("Divs = %d.  Nodes = %d.  Mffc = %d.  Mffc area = %.2f.    ",(double)p->AreaMffc * 0.001,
           (ulong)uVar3,(ulong)uVar1,(ulong)(uint)p->nMffc);
    printf("Pat0 = %d.  Pat1 = %d.    ",(ulong)(uint)p->nPats[0],(ulong)(uint)p->nPats[1]);
    printf("\n");
    if (nAssump != 0) {
      printf("Cofactor: ");
      for (iLit = 0; iLit < nAssump; iLit = iLit + 1) {
        iVar2 = Abc_LitIsCompl(pAssump[iLit]);
        pcVar5 = "";
        if (iVar2 != 0) {
          pcVar5 = "!";
        }
        uVar3 = Abc_Lit2Var(pAssump[iLit]);
        printf(" %s%d",pcVar5,(ulong)uVar3);
      }
      printf("\n");
    }
  }
  for (d = 0; d < 2; d = d + 1) {
    iVar2 = Abc_TtIsConst0(Masks[d],p->nPatWords[d]);
    if (iVar2 != 0) {
      p->nSatCalls = p->nSatCalls + 1;
      iVar2 = Abc_Var2Lit(p->iTarget,d);
      pAssump[nAssump] = iVar2;
      Impls = (int  [2])Abc_Clock();
      iVar2 = sat_solver_solve(p->pSat,pAssump,pAssump + (long)nAssump + 1,(long)iVar4,0,0,0);
      if (iVar2 == 0) {
        p->nTimeOuts = p->nTimeOuts + 1;
        return -2;
      }
      if (iVar2 == -1) {
        p->nSatCallsUnsat = p->nSatCallsUnsat + 1;
        aVar6 = Abc_Clock();
        p->timeSatUnsat = (aVar6 - (long)Impls) + p->timeSatUnsat;
        iVar4 = Abc_TtWordNum(p->pPars->nVarMax);
        Abc_TtConst(pTruth,iVar4,d);
        if (p->pPars->fVeryVerbose != 0) {
          printf("Found constant %d.\n",(ulong)(uint)d);
        }
        return 0;
      }
      if (iVar2 != 1) {
        __assert_fail("status == l_True",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                      ,0x355,
                      "int Sfm_DecPeformDec_rec(Sfm_Dec_t *, word *, int *, int *, int, word (*)[8], int, int)"
                     );
      }
      p->nSatCallsSat = p->nSatCallsSat + 1;
      aVar6 = Abc_Clock();
      p->timeSatSat = (aVar6 - (long)Impls) + p->timeSatSat;
      if (p->nPats[d] == 0x200) {
        p->nSatCallsOver = p->nSatCallsOver + 1;
      }
      else {
        for (iLit = 0; iLit < p->nDivs; iLit = iLit + 1) {
          iVar2 = sat_solver_var_value(p->pSat,iLit);
          if (iVar2 != 0) {
            pwVar7 = Sfm_DecDivPats(p,iLit,d);
            Abc_TtSetBit(pwVar7,p->nPats[d]);
          }
        }
        p->nPatWords[d] = (p->nPats[d] >> 6) + 1;
        iVar2 = p->nPats[d];
        p->nPats[d] = iVar2 + 1;
        Abc_TtSetBit(Masks[d],iVar2);
      }
    }
  }
  if (p->iUseThis == -1) {
    Vec_IntClear(p->vImpls);
    Vec_IntClear(p->vImpls + 1);
    for (status = 0; status < p->nDivs; status = status + 1) {
      pPats = (word *)0xffffffffffffffff;
      for (d = 0; d < 2; d = d + 1) {
        _fHas1s = Sfm_DecDivPats(p,status,d);
        pFinal._4_4_ = Abc_TtIntersect(_fHas1s,Masks[d],p->nPatWords[d],1);
        pFinal._0_4_ = Abc_TtIntersect(_fHas1s,Masks[d],p->nPatWords[d],0);
        if ((pFinal._4_4_ == 0) || ((int)pFinal == 0)) {
          iVar2 = Abc_Var2Lit(p->iTarget,d);
          pAssump[nAssump] = iVar2;
          iVar2 = Abc_Var2Lit(status,(int)pFinal);
          pAssump[nAssump + 1] = iVar2;
          Impls = (int  [2])Abc_Clock();
          iVar2 = Abc_TtGetBit(pwVar8,status * 4 + d * 2 + (int)pFinal);
          if (iVar2 == 0) {
            p->nSatCalls = p->nSatCalls + 1;
            local_60 = sat_solver_solve(p->pSat,pAssump,pAssump + (long)nAssump + 2,(long)iVar4,0,0,
                                        0);
          }
          else {
            p->nSatCallsUnsat = p->nSatCallsUnsat + -1;
            local_60 = -1;
          }
          if (local_60 == 0) {
            p->nTimeOuts = p->nTimeOuts + 1;
            return -2;
          }
          if (local_60 == -1) {
            p->nSatCallsUnsat = p->nSatCallsUnsat + 1;
            aVar6 = Abc_Clock();
            p->timeSatUnsat = (aVar6 - (long)Impls) + p->timeSatUnsat;
            iVar2 = Abc_LitNot(pAssump[nAssump + 1]);
            Impls[(long)d + -2] = iVar2;
            iVar2 = Abc_LitNot(pAssump[nAssump + 1]);
            Vec_IntPush(p->vImpls + d,iVar2);
            Abc_TtSetBit(pwVar8,status * 4 + d * 2 + (int)pFinal);
          }
          else {
            if (local_60 != 1) {
              __assert_fail("status == l_True",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                            ,0x393,
                            "int Sfm_DecPeformDec_rec(Sfm_Dec_t *, word *, int *, int *, int, word (*)[8], int, int)"
                           );
            }
            p->nSatCallsSat = p->nSatCallsSat + 1;
            aVar6 = Abc_Clock();
            p->timeSatSat = (aVar6 - (long)Impls) + p->timeSatSat;
            if (p->nPats[d] == 0x200) {
              p->nSatCallsOver = p->nSatCallsOver + 1;
            }
            else {
              for (iLit = 0; iLit < p->nDivs; iLit = iLit + 1) {
                iVar2 = sat_solver_var_value(p->pSat,iLit);
                if (iVar2 != 0) {
                  pwVar7 = Sfm_DecDivPats(p,iLit,d);
                  Abc_TtSetBit(pwVar7,p->nPats[d]);
                }
              }
              p->nPatWords[d] = (p->nPats[d] >> 6) + 1;
              iVar2 = p->nPats[d];
              p->nPats[d] = iVar2 + 1;
              Abc_TtSetBit(Masks[d],iVar2);
            }
          }
        }
      }
      if (((int)pPats != -1) && (pPats._4_4_ != -1)) {
        if ((int)pPats != pPats._4_4_) {
          iVar4 = Abc_Lit2Var((int)pPats);
          iVar2 = Abc_Lit2Var(pPats._4_4_);
          if (iVar4 == iVar2) {
            iVar4 = Abc_TtWordNum(p->pPars->nVarMax);
            iVar2 = Abc_LitIsCompl((int)pPats);
            Abc_TtUnit(pTruth,iVar4,iVar2);
            iVar4 = Abc_Lit2Var((int)pPats);
            *pSupp = iVar4;
            if (p->pPars->fVeryVerbose != 0) {
              iVar4 = Abc_LitIsCompl((int)pPats);
              pcVar5 = "";
              if (iVar4 != 0) {
                pcVar5 = "!";
              }
              printf("Found variable %s%d.\n",pcVar5,(ulong)(uint)*pSupp);
            }
            return 1;
          }
          __assert_fail("Abc_Lit2Var(Impls[0]) == Abc_Lit2Var(Impls[1])",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                        ,0x3aa,
                        "int Sfm_DecPeformDec_rec(Sfm_Dec_t *, word *, int *, int *, int, word (*)[8], int, int)"
                       );
        }
        Vec_IntPop(p->vImpls);
        Vec_IntPop(p->vImpls + 1);
      }
    }
    if (p->pPars->nVarMax + -2 < nSuppAdd) {
      if (p->pPars->fVeryVerbose != 0) {
        printf("The number of assumption is more than MFFC size.\n");
      }
      return -2;
    }
    if (p->pPars->fUseAndOr != 0) {
      for (d = 0; d < 2; d = d + 1) {
        iVar2 = Vec_IntSize(p->vImpls + (int)(uint)((d != 0 ^ 0xffU) & 1));
        if (1 < iVar2) {
          p->nSatCalls = p->nSatCalls + 1;
          iVar2 = Abc_Var2Lit(p->iTarget,d);
          pAssump[nAssump] = iVar2;
          iVar2 = Vec_IntSize(p->vImpls + (int)(uint)((d != 0 ^ 0xffU) & 1));
          if (0x3dd < iVar2) {
            __assert_fail("Vec_IntSize(&p->vImpls[!c]) < SFM_WIN_MAX-10",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                          ,0x3c0,
                          "int Sfm_DecPeformDec_rec(Sfm_Dec_t *, word *, int *, int *, int, word (*)[8], int, int)"
                         );
          }
          for (iLit = 0; iVar2 = Vec_IntSize(p->vImpls + (int)(uint)((d != 0 ^ 0xffU) & 1)),
              iLit < iVar2; iLit = iLit + 1) {
            iVar2 = Vec_IntEntry(p->vImpls + (int)(uint)((d != 0 ^ 0xffU) & 1),iLit);
            pAssump[nAssump + 1 + iLit] = iVar2;
          }
          Impls = (int  [2])Abc_Clock();
          iVar2 = sat_solver_solve(p->pSat,pAssump,pAssump + (long)nAssump + (long)iLit + 1,
                                   (long)iVar4,0,0,0);
          if (iVar2 == 0) {
            p->nTimeOuts = p->nTimeOuts + 1;
            return -2;
          }
          if (iVar2 == -1) {
            iVar2 = sat_solver_final(p->pSat,&stack0xffffffffffffff68);
            p->nSatCallsUnsat = p->nSatCallsUnsat + 1;
            aVar6 = Abc_Clock();
            p->timeSatUnsat = (aVar6 - (long)Impls) + p->timeSatUnsat;
            if (iVar2 + nSuppAdd < 7) {
              status = 0;
              for (iLit = 0; iLit < iVar2; iLit = iLit + 1) {
                iVar4 = Abc_LitNot(piStack_98[iLit]);
                iVar4 = Vec_IntFind(p->vImpls + (int)(uint)((d != 0 ^ 0xffU) & 1),iVar4);
                if (-1 < iVar4) {
                  iVar4 = Abc_LitNot(piStack_98[iLit]);
                  pSupp[status] = iVar4;
                  status = status + 1;
                }
              }
              if (status < 7) {
                if (d == 0) {
                  *pTruth = 0;
                  for (iLit = 0; iLit < status; iLit = iLit + 1) {
                    iVar4 = Abc_LitIsCompl(pSupp[iLit]);
                    if (iVar4 == 0) {
                      local_250 = s_Truths6[iLit] ^ 0xffffffffffffffff;
                    }
                    else {
                      local_250 = s_Truths6[iLit];
                    }
                    *pTruth = local_250 | *pTruth;
                    iVar4 = Abc_Lit2Var(pSupp[iLit]);
                    pSupp[iLit] = iVar4;
                  }
                }
                else {
                  *pTruth = 0xffffffffffffffff;
                  for (iLit = 0; iLit < status; iLit = iLit + 1) {
                    iVar4 = Abc_LitIsCompl(pSupp[iLit]);
                    if (iVar4 == 0) {
                      local_248 = s_Truths6[iLit];
                    }
                    else {
                      local_248 = s_Truths6[iLit] ^ 0xffffffffffffffff;
                    }
                    *pTruth = local_248 & *pTruth;
                    iVar4 = Abc_Lit2Var(pSupp[iLit]);
                    pSupp[iLit] = iVar4;
                  }
                }
                Abc_TtStretch6(pTruth,status,p->pPars->nVarMax);
                p->nNodesAndOr = p->nNodesAndOr + 1;
                if (p->pPars->fVeryVerbose != 0) {
                  printf("Found %d-input AND/OR gate.\n",(ulong)(uint)status);
                }
                return status;
              }
              __assert_fail("nFinal <= 6",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                            ,0x3d7,
                            "int Sfm_DecPeformDec_rec(Sfm_Dec_t *, word *, int *, int *, int, word (*)[8], int, int)"
                           );
            }
          }
          else {
            if (iVar2 != 1) {
              __assert_fail("status == l_True",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                            ,0x3f0,
                            "int Sfm_DecPeformDec_rec(Sfm_Dec_t *, word *, int *, int *, int, word (*)[8], int, int)"
                           );
            }
            p->nSatCallsSat = p->nSatCallsSat + 1;
            aVar6 = Abc_Clock();
            p->timeSatSat = (aVar6 - (long)Impls) + p->timeSatSat;
            if (p->nPats[d] == 0x200) {
              p->nSatCallsOver = p->nSatCallsOver + 1;
            }
            else {
              for (iLit = 0; iLit < p->nDivs; iLit = iLit + 1) {
                iVar2 = sat_solver_var_value(p->pSat,iLit);
                if (iVar2 != 0) {
                  pwVar8 = Sfm_DecDivPats(p,iLit,d);
                  Abc_TtSetBit(pwVar8,p->nPats[d]);
                }
              }
              p->nPatWords[d] = (p->nPats[d] >> 6) + 1;
              iVar2 = p->nPats[d];
              p->nPats[d] = iVar2 + 1;
              Abc_TtSetBit(Masks[d],iVar2);
            }
          }
        }
      }
    }
    pDivWords._4_4_ = Sfm_DecFindBestVar(p,Masks);
    if ((pDivWords._4_4_ == -1) && (fCofactor != 0)) {
      iLit = Vec_IntSize(&p->vObjInMffc);
      do {
        iLit = iLit + -1;
        if (iLit < 0) break;
        pDivWords._4_4_ = Vec_IntEntry(&p->vObjInMffc,iLit);
        iVar4 = Vec_IntFind(&p->vObjDec,pDivWords._4_4_);
      } while (iVar4 != -1);
      if (iLit == -1) {
        pDivWords._4_4_ = -1;
      }
      fCofactor = 0;
    }
    if (p->pPars->fVeryVerbose != 0) {
      Sfm_DecPrint(p,Masks);
      printf("Best var %d\n");
      printf("\n");
    }
  }
  else {
    pDivWords._4_4_ = p->iUseThis;
    p->iUseThis = -1;
  }
  if (pDivWords._4_4_ < 0) {
    p_local._4_4_ = -2;
  }
  else {
    memset(local_200,0,8);
    Vec_IntPush(&p->vObjDec,pDivWords._4_4_);
    for (iLit = 0; iLit < 2; iLit = iLit + 1) {
      for (d = 0; d < 2; d = d + 1) {
        pwVar8 = Sfm_DecDivPats(p,pDivWords._4_4_,d);
        Abc_TtAndSharp((word *)(&stack0xfffffffffffffe98 + (long)d * 0x40),Masks[d],pwVar8,
                       p->nPatWords[d],(uint)((iLit != 0 ^ 0xffU) & 1));
        for (local_16c = p->nPatWords[d]; local_16c < 8; local_16c = local_16c + 1) {
          *(undefined8 *)(&stack0xfffffffffffffe98 + (long)local_16c * 8 + (long)d * 0x40) = 0;
        }
      }
      iVar4 = Abc_Var2Lit(pDivWords._4_4_,(uint)((iLit != 0 ^ 0xffU) & 1));
      pAssump[nAssump] = iVar4;
      memcpy(p->pDivWords[nAssump + 1],p->pDivWords[nAssump],(long)p->nDivWords << 3);
      if (iLit == 0) {
        local_2a4 = 0;
      }
      else {
        local_2a4 = local_200[0];
      }
      iVar4 = Sfm_DecPeformDec_rec
                        (p,uTruth[(long)iLit + -1] + 3,Supp[(long)iLit + -1] + 0xe,pAssump,
                         nAssump + 1,(word (*) [8])&stack0xfffffffffffffe98,fCofactor,
                         local_2a4 + nSuppAdd + 1);
      local_200[iLit] = iVar4;
      if (local_200[iLit] == -2) {
        return -2;
      }
    }
    p_local._4_4_ =
         Sfm_DecCombineDec(p,MasksNext[1] + 7,uTruth[0] + 3,nSupp,Supp[0] + 0xe,local_200[0],
                           local_200[1],pTruth,pSupp,pDivWords._4_4_);
  }
  return p_local._4_4_;
}

Assistant:

int Sfm_DecPeformDec_rec( Sfm_Dec_t * p, word * pTruth, int * pSupp, int * pAssump, int nAssump, word Masks[2][SFM_SIM_WORDS], int fCofactor, int nSuppAdd )
{
    int nBTLimit = p->pPars->nBTLimit;
//    int fVerbose = p->pPars->fVeryVerbose;
    int c, i, d, iLit, status, Var = -1;
    word * pDivWords = p->pDivWords[nAssump];
    abctime clk;
    assert( nAssump <= SFM_SUPP_MAX );
    if ( p->pPars->fVeryVerbose )
    {
        printf( "\nObject %d\n", p->iTarget );
        printf( "Divs = %d.  Nodes = %d.  Mffc = %d.  Mffc area = %.2f.    ", p->nDivs, Vec_IntSize(&p->vObjGates), p->nMffc, MIO_NUMINV*p->AreaMffc );
        printf( "Pat0 = %d.  Pat1 = %d.    ", p->nPats[0], p->nPats[1] );
        printf( "\n" );
        if ( nAssump )
        {
            printf( "Cofactor: " );
            for ( i = 0; i < nAssump; i++ )
                printf( " %s%d", Abc_LitIsCompl(pAssump[i])? "!":"", Abc_Lit2Var(pAssump[i]) );
            printf( "\n" );
        }
    }
    // check constant
    for ( c = 0; c < 2; c++ )
    {
        if ( !Abc_TtIsConst0(Masks[c], p->nPatWords[c]) ) // there are some patterns
            continue;
        p->nSatCalls++;
        pAssump[nAssump] = Abc_Var2Lit( p->iTarget, c );
        clk = Abc_Clock();
        status = sat_solver_solve( p->pSat, pAssump, pAssump + nAssump + 1, nBTLimit, 0, 0, 0 );
        if ( status == l_Undef )
        {
            p->nTimeOuts++;
            return -2;
        }
        if ( status == l_False )
        {
            p->nSatCallsUnsat++;
            p->timeSatUnsat += Abc_Clock() - clk;
            Abc_TtConst( pTruth, Abc_TtWordNum(p->pPars->nVarMax), c );
            if ( p->pPars->fVeryVerbose )
                printf( "Found constant %d.\n", c );
            return 0;
        }
        assert( status == l_True );
        p->nSatCallsSat++;
        p->timeSatSat += Abc_Clock() - clk;
        if ( p->nPats[c] == 64*SFM_SIM_WORDS )
        {
            p->nSatCallsOver++;
            continue;//return -2;//continue;
        }
        for ( i = 0; i < p->nDivs; i++ )
            if ( sat_solver_var_value(p->pSat, i) )
                Abc_TtSetBit( Sfm_DecDivPats(p, i, c), p->nPats[c] );
        p->nPatWords[c] = 1 + (p->nPats[c] >> 6);
        Abc_TtSetBit( Masks[c], p->nPats[c]++ );
    }

    if ( p->iUseThis != -1 )
    {
        Var = p->iUseThis;
        p->iUseThis = -1;
        goto cofactor;
    }

    // check implications
    Vec_IntClear( &p->vImpls[0] );
    Vec_IntClear( &p->vImpls[1] );
    for ( d = 0; d < p->nDivs; d++ )
    {
        int Impls[2] = {-1, -1};
        for ( c = 0; c < 2; c++ )
        {
            word * pPats = Sfm_DecDivPats( p, d, c );
            int fHas0s = Abc_TtIntersect( pPats, Masks[c], p->nPatWords[c], 1 );
            int fHas1s = Abc_TtIntersect( pPats, Masks[c], p->nPatWords[c], 0 );
            if ( fHas0s && fHas1s )
                continue;
            pAssump[nAssump]   = Abc_Var2Lit( p->iTarget, c );
            pAssump[nAssump+1] = Abc_Var2Lit( d, fHas1s ); // if there are 1s, check if 0 is SAT
            clk = Abc_Clock();
            if ( Abc_TtGetBit( pDivWords, 4*d+2*c+fHas1s ) )
            {
                p->nSatCallsUnsat--;
                status = l_False;
            }
            else
            {
                p->nSatCalls++;
                status = sat_solver_solve( p->pSat, pAssump, pAssump + nAssump + 2, nBTLimit, 0, 0, 0 );
            }
            if ( status == l_Undef )
            {
                p->nTimeOuts++;
                return -2;
            }
            if ( status == l_False )
            {
                p->nSatCallsUnsat++;
                p->timeSatUnsat += Abc_Clock() - clk;
                Impls[c] = Abc_LitNot(pAssump[nAssump+1]);
                Vec_IntPush( &p->vImpls[c], Abc_LitNot(pAssump[nAssump+1]) );
                Abc_TtSetBit( pDivWords, 4*d+2*c+fHas1s );
                continue;
            }
            assert( status == l_True );
            p->nSatCallsSat++;
            p->timeSatSat += Abc_Clock() - clk;
            if ( p->nPats[c] == 64*SFM_SIM_WORDS )
            {
                p->nSatCallsOver++;
                continue;//return -2;//continue;
            }
            // record this status
            for ( i = 0; i < p->nDivs; i++ )
                if ( sat_solver_var_value(p->pSat, i) )
                    Abc_TtSetBit( Sfm_DecDivPats(p, i, c), p->nPats[c] );
            p->nPatWords[c] = 1 + (p->nPats[c] >> 6);
            Abc_TtSetBit( Masks[c], p->nPats[c]++ );
        }
        if ( Impls[0] == -1 || Impls[1] == -1 )
            continue;
        if ( Impls[0] == Impls[1] )
        {
            Vec_IntPop( &p->vImpls[0] );
            Vec_IntPop( &p->vImpls[1] );
            continue;
        }
        assert( Abc_Lit2Var(Impls[0]) == Abc_Lit2Var(Impls[1]) );
        // found buffer/inverter
        Abc_TtUnit( pTruth, Abc_TtWordNum(p->pPars->nVarMax), Abc_LitIsCompl(Impls[0]) );
        pSupp[0] = Abc_Lit2Var(Impls[0]);
        if ( p->pPars->fVeryVerbose )
            printf( "Found variable %s%d.\n", Abc_LitIsCompl(Impls[0]) ? "!":"", pSupp[0] );
        return 1;        
    }
    if ( nSuppAdd > p->pPars->nVarMax - 2 )
    {
        if ( p->pPars->fVeryVerbose )
            printf( "The number of assumption is more than MFFC size.\n" );
        return -2;
    }
    // try using all implications at once
    if ( p->pPars->fUseAndOr )
    for ( c = 0; c < 2; c++ )
    {
        if ( Vec_IntSize(&p->vImpls[!c]) < 2 )
            continue;
        p->nSatCalls++;
        pAssump[nAssump] = Abc_Var2Lit( p->iTarget, c );
        assert( Vec_IntSize(&p->vImpls[!c]) < SFM_WIN_MAX-10 );
        Vec_IntForEachEntry( &p->vImpls[!c], iLit, i )
            pAssump[nAssump+1+i] = iLit;
        clk = Abc_Clock();
        status = sat_solver_solve( p->pSat, pAssump, pAssump + nAssump+1+i, nBTLimit, 0, 0, 0 );
        if ( status == l_Undef )
        {
            p->nTimeOuts++;
            return -2;
        }
        if ( status == l_False )
        {
            int * pFinal, nFinal = sat_solver_final( p->pSat, &pFinal );
            p->nSatCallsUnsat++;
            p->timeSatUnsat += Abc_Clock() - clk;
            if ( nFinal + nSuppAdd > 6 )
                continue;
            // collect only relevant literals
            for ( i = d = 0; i < nFinal; i++ )
                if ( Vec_IntFind(&p->vImpls[!c], Abc_LitNot(pFinal[i])) >= 0 )
                    pSupp[d++] = Abc_LitNot(pFinal[i]);
            nFinal = d;
            // create AND/OR gate
            assert( nFinal <= 6 );
            if ( c )
            {
                *pTruth = ~(word)0;
                for ( i = 0; i < nFinal; i++ )
                {
                    *pTruth &= Abc_LitIsCompl(pSupp[i]) ? ~s_Truths6[i] : s_Truths6[i];
                    pSupp[i] = Abc_Lit2Var(pSupp[i]);
                }
            }
            else
            {
                *pTruth = 0;
                for ( i = 0; i < nFinal; i++ )
                {
                    *pTruth |= Abc_LitIsCompl(pSupp[i]) ? s_Truths6[i] : ~s_Truths6[i];
                    pSupp[i] = Abc_Lit2Var(pSupp[i]);
                }
            }
            Abc_TtStretch6( pTruth, nFinal, p->pPars->nVarMax );
            p->nNodesAndOr++;
            if ( p->pPars->fVeryVerbose )
                printf( "Found %d-input AND/OR gate.\n", nFinal );
            return nFinal;
        }
        assert( status == l_True );
        p->nSatCallsSat++;
        p->timeSatSat += Abc_Clock() - clk;
        if ( p->nPats[c] == 64*SFM_SIM_WORDS )
        {
            p->nSatCallsOver++;
            continue;//return -2;//continue;
        }
        for ( i = 0; i < p->nDivs; i++ )
            if ( sat_solver_var_value(p->pSat, i) )
                Abc_TtSetBit( Sfm_DecDivPats(p, i, c), p->nPats[c] );
        p->nPatWords[c] = 1 + (p->nPats[c] >> 6);
        Abc_TtSetBit( Masks[c], p->nPats[c]++ );
    }

    // find the best cofactoring variable
//    if ( !fCofactor || Vec_IntSize(&p->vImpls[0]) + Vec_IntSize(&p->vImpls[1]) > 2 )
    Var = Sfm_DecFindBestVar( p, Masks );
//    if ( Var == -1 )
//        Var = Sfm_DecFindBestVar2( p, Masks );

/*
    {
        int Lit0 = Vec_IntSize(&p->vImpls[0]) ? Vec_IntEntry(&p->vImpls[0], 0) : -1;
        int Lit1 = Vec_IntSize(&p->vImpls[1]) ? Vec_IntEntry(&p->vImpls[1], 0) : -1;
        if ( Lit0 == -1 && Lit1 >= 0 )
            Var = Abc_Lit2Var(Lit1);
        else if ( Lit1 == -1 && Lit0 >= 0 )
            Var = Abc_Lit2Var(Lit0);
        else if ( Lit0 >= 0 && Lit1 >= 0 )
        {
            if ( Lit0 < Lit1 )
                Var = Abc_Lit2Var(Lit0);
            else
                Var = Abc_Lit2Var(Lit1);
        }
    }
*/

    if ( Var == -1 && fCofactor )
    {
        //for ( Var = p->nDivs - 1; Var >= 0; Var-- )
        Vec_IntForEachEntryReverse( &p->vObjInMffc, Var, i )
            if ( Vec_IntFind(&p->vObjDec, Var) == -1 )
                break;
//        if ( i == Vec_IntSize(&p->vObjInMffc) )
        if ( i == -1 )
            Var = -1;
        fCofactor = 0;
    }

    if ( p->pPars->fVeryVerbose )
    {
        Sfm_DecPrint( p, Masks );
        printf( "Best var %d\n", Var );
        printf( "\n" );
    }
cofactor:
    // cofactor the problem
    if ( Var >= 0 )
    {
        word uTruth[2][SFM_WORD_MAX], MasksNext[2][SFM_SIM_WORDS];
        int w, Supp[2][2*SFM_SUPP_MAX], nSupp[2] = {0};
        Vec_IntPush( &p->vObjDec, Var );
        for ( i = 0; i < 2; i++ )
        {
            for ( c = 0; c < 2; c++ )
            {
                Abc_TtAndSharp( MasksNext[c], Masks[c], Sfm_DecDivPats(p, Var, c), p->nPatWords[c], !i );
                for ( w = p->nPatWords[c]; w < SFM_SIM_WORDS; w++ )
                    MasksNext[c][w] = 0;
            }
            pAssump[nAssump] = Abc_Var2Lit( Var, !i );
            memcpy( p->pDivWords[nAssump+1], p->pDivWords[nAssump], sizeof(word) * p->nDivWords );
            nSupp[i] = Sfm_DecPeformDec_rec( p, uTruth[i], Supp[i], pAssump, nAssump+1, MasksNext, fCofactor, (i ? nSupp[0] : 0) + nSuppAdd + 1 );
            if ( nSupp[i] == -2 )
                return -2;
        }
        // combine solutions
        return Sfm_DecCombineDec( p, uTruth[0], uTruth[1], Supp[0], Supp[1], nSupp[0], nSupp[1], pTruth, pSupp, Var );
    }
    return -2;
}